

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsysinfo.cpp
# Opt level: O3

QString * QSysInfo::machineHostName(void)

{
  char *__s;
  int iVar1;
  char *pcVar2;
  storage_type *in_RCX;
  char *pcVar3;
  QString *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView ba;
  utsname u;
  utsname local_19e;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_19e,0xaa,0x186);
  iVar1 = uname(&local_19e);
  if (iVar1 == 0) {
    __s = local_19e.nodename;
    pcVar2 = (char *)memchr(__s,0,0x41);
    pcVar3 = local_19e.release;
    if (pcVar2 != (char *)0x0) {
      pcVar3 = pcVar2;
    }
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)__s;
    QString::fromLocal8Bit(in_RDI,(QString *)(pcVar3 + -(long)__s),ba);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_002188bc;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
LAB_002188bc:
      __stack_chk_fail();
    }
    (in_RDI->d).d = (Data *)0x0;
    (in_RDI->d).ptr = (char16_t *)0x0;
    (in_RDI->d).size = 0;
  }
  return in_RDI;
}

Assistant:

QString QSysInfo::machineHostName()
{
    // the hostname can change, so we can't cache it
#if defined(Q_OS_LINUX)
    // gethostname(3) on Linux just calls uname(2), so do it ourselves
    // and avoid a memcpy
    struct utsname u;
    if (uname(&u) == 0)
        return QString::fromLocal8Bit(u.nodename);
    return QString();
#else
#  ifdef Q_OS_WIN
    // Important: QtNetwork depends on machineHostName() initializing ws2_32.dll
    winsockInit();
    QString hostName;
    hostName.resize(512);
    unsigned long len = hostName.size();
    BOOL res = GetComputerNameEx(ComputerNameDnsHostname,
                                 reinterpret_cast<wchar_t *>(hostName.data()), &len);
    if (!res && len > 512) {
        hostName.resize(len - 1);
        GetComputerNameEx(ComputerNameDnsHostname, reinterpret_cast<wchar_t *>(hostName.data()),
                          &len);
    }
    hostName.truncate(len);
    return hostName;
#  else // !Q_OS_WIN

    char hostName[512];
    if (gethostname(hostName, sizeof(hostName)) == -1)
        return QString();
    hostName[sizeof(hostName) - 1] = '\0';
    return QString::fromLocal8Bit(hostName);
#  endif
#endif
}